

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

CursorType * __thiscall
duckdb::QuantileState<long,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
          (QuantileState<long,_duckdb::QuantileStandardType> *this,WindowPartitionInput *partition)

{
  bool bVar1;
  type pQVar2;
  WindowPartitionInput *in_RDI;
  unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
  *in_stack_ffffffffffffffd8;
  WindowPartitionInput *args;
  
  args = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
                      *)0xa1f931);
  if (!bVar1) {
    make_uniq<duckdb::QuantileCursor<long>,duckdb::WindowPartitionInput_const&>(args);
    unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
    ::operator=((unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
                 *)in_RDI,in_stack_ffffffffffffffd8);
    unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
                   *)0xa1f961);
  }
  pQVar2 = unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
           ::operator*((unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
                        *)in_RDI);
  return pQVar2;
}

Assistant:

CursorType &GetOrCreateWindowCursor(const WindowPartitionInput &partition) {
		if (!window_cursor) {
			window_cursor = make_uniq<CursorType>(partition);
		}
		return *window_cursor;
	}